

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandBuffer.cpp
# Opt level: O3

vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
* myvk::CommandBuffer::CreateMultiple
            (vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
             *__return_storage_ptr__,Ptr<CommandPool> *command_pool,uint32_t count,
            VkCommandBufferLevel level)

{
  pointer psVar1;
  PFN_vkAllocateCommandBuffers p_Var2;
  int iVar3;
  VkResult VVar4;
  undefined4 extraout_var;
  long lVar5;
  long lVar6;
  ulong __n;
  shared_ptr<myvk::CommandBuffer> ptr;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> handles;
  undefined1 local_81;
  long local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_> local_70;
  VkCommandBufferAllocateInfo local_58;
  
  local_58.pNext = (void *)0x0;
  local_58.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_58._4_4_ = 0;
  local_58.commandPool =
       ((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
       m_command_pool;
  __n = (ulong)count;
  local_58.level = level;
  local_58.commandBufferCount = count;
  std::vector<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>::vector
            (&local_70,__n,(allocator_type *)&local_80);
  p_Var2 = vkAllocateCommandBuffers;
  iVar3 = (*(((command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_DeviceObjectBase).super_Base._vptr_Base[2])();
  VVar4 = (*p_Var2)(*(VkDevice *)(*(long *)CONCAT44(extraout_var,iVar3) + 0x268),&local_58,
                    local_70.
                    super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  if (VVar4 == VK_SUCCESS) {
    std::
    vector<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    ::vector(__return_storage_ptr__,__n,(allocator_type *)&local_80);
    if (count != 0) {
      lVar5 = 8;
      lVar6 = 0;
      do {
        std::__shared_ptr<myvk::CommandBuffer,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<std::allocator<myvk::CommandBuffer>>
                  ((__shared_ptr<myvk::CommandBuffer,(__gnu_cxx::_Lock_policy)2> *)&local_80,
                   (allocator<myvk::CommandBuffer> *)&local_81);
        *(element_type **)(local_80 + 0x18) =
             (command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 0x20),
                   &(command_pool->super___shared_ptr<myvk::CommandPool,_(__gnu_cxx::_Lock_policy)2>
                    )._M_refcount);
        *(undefined8 *)(local_80 + 0x28) =
             *(undefined8 *)
              ((long)local_70.
                     super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                     _M_impl.super__Vector_impl_data._M_start + lVar6);
        psVar1 = (__return_storage_ptr__->
                 super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        *(long *)((long)&(psVar1->
                         super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                 + lVar6 * 2) = local_80;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   ((long)&(psVar1->
                           super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
                           _M_ptr + lVar5),&local_78);
        if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
        }
        lVar6 = lVar6 + 8;
        lVar5 = lVar5 + 0x10;
      } while (__n << 3 != lVar6);
    }
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::shared_ptr<myvk::CommandBuffer>,_std::allocator<std::shared_ptr<myvk::CommandBuffer>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  if (local_70.super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>._M_impl
      .super__Vector_impl_data._M_start != (VkCommandBuffer *)0x0) {
    operator_delete(local_70.
                    super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_70.
                          super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_70.
                          super__Vector_base<VkCommandBuffer_T_*,_std::allocator<VkCommandBuffer_T_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Ptr<CommandBuffer>> CommandBuffer::CreateMultiple(const Ptr<CommandPool> &command_pool, uint32_t count,
                                                              VkCommandBufferLevel level) {
	VkCommandBufferAllocateInfo alloc_info = {};
	alloc_info.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
	alloc_info.commandPool = command_pool->GetHandle();
	alloc_info.level = level;
	alloc_info.commandBufferCount = count;

	std::vector<VkCommandBuffer> handles(count);

	if (vkAllocateCommandBuffers(command_pool->GetDevicePtr()->GetHandle(), &alloc_info, handles.data()) != VK_SUCCESS)
		return {};

	std::vector<Ptr<CommandBuffer>> ret(count);
	for (uint32_t i = 0; i < count; ++i) {
		auto ptr = std::make_shared<CommandBuffer>();
		ptr->m_command_pool_ptr = command_pool;
		ptr->m_command_buffer = handles[i];
		ret[i] = ptr;
	}

	return ret;
}